

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O0

void __thiscall Al::al_exception::al_exception(al_exception *this,string *m,string *f,int l)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  exception *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff4c;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [52];
  undefined4 local_1c;
  
  local_1c = in_ECX;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__al_exception_0014cc30;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 8);
  std::__cxx11::string::string((string *)__lhs,in_RSI);
  __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
  std::__cxx11::string::string((string *)__lhs_00,in_RDX);
  *(undefined4 *)(in_RDI + 0x48) = local_1c;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x50);
  std::__cxx11::string::string((string *)__rhs);
  std::operator+(__lhs,(char *)in_RSI);
  std::__cxx11::to_string(in_stack_ffffffffffffff4c);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(__lhs_00,(char *)__rhs);
  std::operator+(__lhs_00,__rhs);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x50),local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::__cxx11::string::~string(local_b0);
  return;
}

Assistant:

al_exception(const std::string m, const std::string f, const int l) :
    msg(m), file(f), line(l) {
    err = file + ":" + std::to_string(line) + " - " + msg;
  }